

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall amrex::TagBoxArray::coarsen(TagBoxArray *this,IntVect *ratio)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Box *in_RSI;
  long in_RDI;
  Box result;
  Box result_1;
  Box *cbox;
  MFIter mfi;
  int idim;
  IntVect new_n_grow;
  uchar flags;
  int teamsize;
  int dir;
  IntVect off;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  int in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  int local_368;
  int local_364;
  undefined4 in_stack_fffffffffffffca4;
  uchar flags_;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  MFIter *in_stack_fffffffffffffcb0;
  int local_344;
  int in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  int in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  int local_330;
  int local_32c;
  int local_324;
  int local_320;
  int local_31c;
  int local_30c;
  int local_308;
  int local_304;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  long local_2ac;
  long local_2a4;
  char *local_29c;
  uint local_294;
  undefined1 local_290 [160];
  int local_1f0;
  IntVect local_1ec;
  undefined1 local_1dd;
  int local_1dc;
  Box *local_1d8;
  int local_1c4;
  int local_1b4;
  Box *in_stack_fffffffffffffe50;
  IntVect *v;
  TagBox *this_00;
  int local_168;
  IntVect local_164;
  Box *local_158;
  undefined1 *local_150;
  int local_144;
  Box *local_140;
  int local_134;
  undefined1 *local_130;
  IntVect *local_128;
  undefined1 *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  IntVect *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  undefined4 local_e4;
  Box *local_e0;
  Box *local_d8;
  undefined1 *local_d0;
  Box *local_c8;
  undefined1 *local_c0;
  Box *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  int local_9c;
  undefined1 *local_98;
  undefined4 local_90;
  int local_8c;
  IntVect *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  undefined1 *local_10;
  int local_4;
  
  flags_ = (uchar)((uint)in_stack_fffffffffffffca4 >> 0x18);
  local_1d8 = in_RSI;
  local_1dc = ParallelDescriptor::TeamSize();
  local_1dd = 2;
  if (local_1dc == 1) {
    local_1dd = 0;
  }
  IntVect::IntVect(&local_1ec);
  for (local_1f0 = 0; local_1f0 < 3; local_1f0 = local_1f0 + 1) {
    local_1b4 = local_1f0;
    local_1c4 = local_1f0;
    local_1ec.vect[local_1f0] =
         (*(int *)(in_RDI + 0xc0 + (long)local_1f0 * 4) + (local_1d8->smallend).vect[local_1f0] + -1
         ) / (local_1d8->smallend).vect[local_1f0];
    in_stack_fffffffffffffe50 = local_1d8;
  }
  MFIter::MFIter(in_stack_fffffffffffffcb0,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                 flags_);
  while (uVar1 = local_290._16_8_, bVar3 = MFIter::isValid((MFIter *)(local_290 + 0x40)), bVar3) {
    MFIter::validbox((MFIter *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    local_290._12_4_ = (undefined4)((ulong)local_2a4 >> 0x20);
    local_290._24_4_ = local_294;
    local_150 = local_290;
    local_158 = local_1d8;
    local_e0 = local_1d8;
    local_e4 = 1;
    bVar3 = true;
    if (((local_1d8->smallend).vect[0] == 1) && (bVar3 = true, (local_1d8->smallend).vect[1] == 1))
    {
      bVar3 = (local_1d8->smallend).vect[2] != 1;
    }
    uVar2 = local_290._16_8_;
    if (bVar3) {
      local_b8 = local_1d8;
      local_290._0_4_ = (undefined4)local_2ac;
      local_64 = local_290._0_4_;
      local_68 = (local_1d8->smallend).vect[0];
      local_60 = local_64;
      if (local_68 != 1) {
        if (local_68 == 2) {
          if ((int)local_290._0_4_ < 0) {
            iVar4 = local_290._0_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_2e4 = -iVar4 / 2 + -1;
          }
          else {
            local_2e4 = (int)local_290._0_4_ / 2;
          }
          local_60 = local_2e4;
        }
        else if (local_68 == 4) {
          if ((int)local_290._0_4_ < 0) {
            iVar4 = local_290._0_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_2e8 = -iVar4 / 4 + -1;
          }
          else {
            local_2e8 = (int)local_290._0_4_ / 4;
          }
          local_60 = local_2e8;
        }
        else {
          if ((int)local_290._0_4_ < 0) {
            iVar4 = local_290._0_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_2ec = -iVar4 / local_68 + -1;
          }
          else {
            local_2ec = (int)local_290._0_4_ / local_68;
          }
          local_60 = local_2ec;
        }
      }
      local_70 = (int)((ulong)local_2ac >> 0x20);
      local_74 = (local_1d8->smallend).vect[1];
      local_6c = local_70;
      if (local_74 != 1) {
        if (local_74 == 2) {
          if (local_2ac < 0) {
            iVar4 = local_70 + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_2f4 = -iVar4 / 2 + -1;
          }
          else {
            local_2f4 = local_70 / 2;
          }
          local_6c = local_2f4;
        }
        else if (local_74 == 4) {
          if (local_2ac < 0) {
            iVar4 = local_70 + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_2f8 = -iVar4 / 4 + -1;
          }
          else {
            local_2f8 = local_70 / 4;
          }
          local_6c = local_2f8;
        }
        else {
          if (local_2ac < 0) {
            iVar4 = local_70 + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_2fc = -iVar4 / local_74 + -1;
          }
          else {
            local_2fc = local_70 / local_74;
          }
          local_6c = local_2fc;
        }
      }
      local_290._8_4_ = (undefined4)local_2a4;
      local_7c = local_290._8_4_;
      local_80 = (local_1d8->smallend).vect[2];
      local_78 = local_7c;
      if (local_80 != 1) {
        if (local_80 == 2) {
          if ((int)local_290._8_4_ < 0) {
            iVar4 = local_290._8_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_304 = -iVar4 / 2 + -1;
          }
          else {
            local_304 = (int)local_290._8_4_ / 2;
          }
          local_78 = local_304;
        }
        else if (local_80 == 4) {
          if ((int)local_290._8_4_ < 0) {
            iVar4 = local_290._8_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_308 = -iVar4 / 4 + -1;
          }
          else {
            local_308 = (int)local_290._8_4_ / 4;
          }
          local_78 = local_308;
        }
        else {
          if ((int)local_290._8_4_ < 0) {
            iVar4 = local_290._8_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_30c = -iVar4 / local_80 + -1;
          }
          else {
            local_30c = (int)local_290._8_4_ / local_80;
          }
          local_78 = local_30c;
        }
      }
      local_a8 = local_290 + 0x18;
      local_b0 = local_150;
      if (local_294 == 0) {
        local_c0 = local_290 + 0xc;
        local_c8 = local_1d8;
        local_44 = (local_1d8->smallend).vect[0];
        local_3c = local_290._12_4_;
        if (local_44 != 1) {
          if (local_44 == 2) {
            if (local_2a4 < 0) {
              iVar4 = local_290._12_4_ + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_3c = -iVar4 / 2 + -1;
            }
            else {
              local_3c = (int)local_290._12_4_ / 2;
            }
          }
          else if (local_44 == 4) {
            if (local_2a4 < 0) {
              iVar4 = local_290._12_4_ + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_3c = -iVar4 / 4 + -1;
            }
            else {
              local_3c = (int)local_290._12_4_ / 4;
            }
          }
          else if (local_2a4 < 0) {
            iVar4 = local_290._12_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_3c = -iVar4 / local_44 + -1;
          }
          else {
            local_3c = (int)local_290._12_4_ / local_44;
          }
        }
        local_290._16_4_ = SUB84(local_29c,0);
        local_4c = local_290._16_4_;
        local_50 = (local_1d8->smallend).vect[1];
        local_48 = local_4c;
        if (local_50 != 1) {
          if (local_50 == 2) {
            if ((int)local_290._16_4_ < 0) {
              iVar4 = local_290._16_4_ + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_364 = -iVar4 / 2 + -1;
            }
            else {
              local_364 = (int)local_290._16_4_ / 2;
            }
            local_48 = local_364;
          }
          else if (local_50 == 4) {
            if ((int)local_290._16_4_ < 0) {
              iVar4 = local_290._16_4_ + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_368 = -iVar4 / 4 + -1;
            }
            else {
              local_368 = (int)local_290._16_4_ / 4;
            }
            local_48 = local_368;
          }
          else if ((int)local_290._16_4_ < 0) {
            iVar4 = local_290._16_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            in_stack_fffffffffffffc94 = -iVar4 / local_50 + -1;
            local_48 = in_stack_fffffffffffffc94;
          }
          else {
            in_stack_fffffffffffffc94 = (int)local_290._16_4_ / local_50;
            local_48 = in_stack_fffffffffffffc94;
          }
        }
        local_290._16_8_ = uVar1 & 0xffffffff00000000;
        uVar2 = local_290._16_8_;
        local_290._20_4_ = SUB84(uVar1,4);
        local_58 = local_290._20_4_;
        in_stack_fffffffffffffc90 = (local_1d8->smallend).vect[2];
        local_5c = in_stack_fffffffffffffc90;
        local_54 = local_58;
        local_40 = local_290._12_4_;
        if (in_stack_fffffffffffffc90 != 1) {
          if (in_stack_fffffffffffffc90 == 2) {
            if ((long)uVar1 < 0) {
              iVar4 = local_290._20_4_ + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              in_stack_fffffffffffffc8c = -iVar4 / 2 + -1;
              local_54 = in_stack_fffffffffffffc8c;
            }
            else {
              in_stack_fffffffffffffc8c = (int)local_290._20_4_ / 2;
              local_54 = in_stack_fffffffffffffc8c;
            }
          }
          else if (in_stack_fffffffffffffc90 == 4) {
            if ((long)uVar1 < 0) {
              iVar4 = local_290._20_4_ + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              in_stack_fffffffffffffc88 = -iVar4 / 4 + -1;
              local_54 = in_stack_fffffffffffffc88;
            }
            else {
              in_stack_fffffffffffffc88 = (int)local_290._20_4_ / 4;
              local_54 = in_stack_fffffffffffffc88;
            }
          }
          else if ((long)uVar1 < 0) {
            iVar4 = local_290._20_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            in_stack_fffffffffffffc84 = -iVar4 / in_stack_fffffffffffffc90 + -1;
            local_54 = in_stack_fffffffffffffc84;
          }
          else {
            in_stack_fffffffffffffc84 = (int)local_290._20_4_ / in_stack_fffffffffffffc90;
            local_54 = in_stack_fffffffffffffc84;
          }
        }
      }
      else {
        local_290._16_8_ = local_29c;
        IntVect::IntVect(&local_164,0);
        for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
          local_98 = local_290 + 0x18;
          local_9c = local_168;
          local_14 = local_168;
          local_4 = local_168;
          if ((local_290._24_4_ & 1 << ((byte)local_168 & 0x1f)) != 0) {
            local_130 = local_290 + 0xc;
            local_134 = local_168;
            local_140 = local_158;
            local_144 = local_168;
            if (*(int *)(local_130 + (long)local_168 * 4) % (local_158->smallend).vect[local_168] !=
                0) {
              local_88 = &local_164;
              local_8c = local_168;
              local_90 = 1;
              local_88->vect[local_168] = 1;
            }
          }
          local_10 = local_98;
        }
        local_d0 = local_290 + 0xc;
        local_d8 = local_158;
        local_1c = local_290._12_4_;
        local_20 = (local_158->smallend).vect[0];
        local_18 = local_1c;
        if (local_20 != 1) {
          if (local_20 == 2) {
            if ((int)local_290._12_4_ < 0) {
              local_290._12_4_ = local_290._12_4_ + 1;
              if ((int)local_290._12_4_ < 1) {
                local_290._12_4_ = -local_290._12_4_;
              }
              local_31c = (int)-local_290._12_4_ / 2 + -1;
            }
            else {
              local_31c = (int)local_290._12_4_ / 2;
            }
            local_18 = local_31c;
          }
          else if (local_20 == 4) {
            if ((int)local_290._12_4_ < 0) {
              local_290._12_4_ = local_290._12_4_ + 1;
              if ((int)local_290._12_4_ < 1) {
                local_290._12_4_ = -local_290._12_4_;
              }
              local_320 = (int)-local_290._12_4_ / 4 + -1;
            }
            else {
              local_320 = (int)local_290._12_4_ / 4;
            }
            local_18 = local_320;
          }
          else {
            if ((int)local_290._12_4_ < 0) {
              local_290._12_4_ = local_290._12_4_ + 1;
              if ((int)local_290._12_4_ < 1) {
                local_290._12_4_ = -local_290._12_4_;
              }
              local_324 = (int)-local_290._12_4_ / local_20 + -1;
            }
            else {
              local_324 = (int)local_290._12_4_ / local_20;
            }
            local_18 = local_324;
          }
        }
        local_28 = local_290._16_4_;
        local_2c = (local_158->smallend).vect[1];
        local_24 = local_28;
        if (local_2c != 1) {
          if (local_2c == 2) {
            if ((int)local_290._16_4_ < 0) {
              iVar4 = local_290._16_4_ + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_32c = -iVar4 / 2 + -1;
            }
            else {
              local_32c = (int)local_290._16_4_ / 2;
            }
            local_24 = local_32c;
          }
          else if (local_2c == 4) {
            if ((int)local_290._16_4_ < 0) {
              iVar4 = local_290._16_4_ + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_330 = -iVar4 / 4 + -1;
            }
            else {
              local_330 = (int)local_290._16_4_ / 4;
            }
            local_24 = local_330;
          }
          else if ((int)local_290._16_4_ < 0) {
            iVar4 = local_290._16_4_ + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            in_stack_fffffffffffffccc = -iVar4 / local_2c + -1;
            local_24 = in_stack_fffffffffffffccc;
          }
          else {
            in_stack_fffffffffffffccc = (int)local_290._16_4_ / local_2c;
            local_24 = in_stack_fffffffffffffccc;
          }
        }
        local_34 = SUB84(local_290._16_8_,4);
        in_stack_fffffffffffffcc8 = (local_158->smallend).vect[2];
        local_30 = local_34;
        if (in_stack_fffffffffffffcc8 != 1) {
          if (in_stack_fffffffffffffcc8 == 2) {
            if ((long)local_290._16_8_ < 0) {
              iVar4 = local_34 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              in_stack_fffffffffffffcc4 = -iVar4 / 2 + -1;
              local_30 = in_stack_fffffffffffffcc4;
            }
            else {
              in_stack_fffffffffffffcc4 = local_34 / 2;
              local_30 = in_stack_fffffffffffffcc4;
            }
          }
          else if (in_stack_fffffffffffffcc8 == 4) {
            if ((long)local_290._16_8_ < 0) {
              iVar4 = local_34 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              in_stack_fffffffffffffcc0 = -iVar4 / 4 + -1;
              local_30 = in_stack_fffffffffffffcc0;
            }
            else {
              in_stack_fffffffffffffcc0 = local_34 / 4;
              local_30 = in_stack_fffffffffffffcc0;
            }
          }
          else {
            if ((long)local_290._16_8_ < 0) {
              iVar4 = local_34 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_344 = -iVar4 / in_stack_fffffffffffffcc8 + -1;
            }
            else {
              local_344 = local_34 / in_stack_fffffffffffffcc8;
            }
            local_30 = local_344;
          }
        }
        local_120 = local_290 + 0xc;
        local_128 = &local_164;
        local_f4 = 0;
        local_104 = 1;
        local_114 = 2;
        local_110 = local_128;
        local_100 = local_128;
        local_f0 = local_128;
        local_38 = in_stack_fffffffffffffcc8;
        uVar2 = local_290._16_8_;
      }
    }
    local_290._16_8_ = uVar2;
    this_00 = (TagBox *)local_290;
    v = &local_1ec;
    Box::grow((Box *)(local_290 + 0x1c),v);
    local_290._56_8_ = local_290 + 0x1c;
    FabArray<amrex::TagBox>::fabPtr
              ((FabArray<amrex::TagBox> *)
               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (MFIter *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TagBox::coarsen(this_00,v,in_stack_fffffffffffffe50);
    MFIter::operator++((MFIter *)(local_290 + 0x40));
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  BoxArray::coarsen((BoxArray *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                    (IntVect *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  *(undefined8 *)(in_RDI + 0xc0) = local_1ec.vect._0_8_;
  *(int *)(in_RDI + 200) = local_1ec.vect[2];
  return;
}

Assistant:

void
TagBoxArray::coarsen (const IntVect & ratio)
{
    // If team is used, all team workers need to go through all the fabs,
    // including ones they don't own.
    int teamsize = ParallelDescriptor::TeamSize();
    unsigned char flags = (teamsize == 1) ? 0 : MFIter::AllBoxes;

    IntVect new_n_grow;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        new_n_grow[idim] = (n_grow[idim]+ratio[idim]-1)/ratio[idim];
    }

#if defined(AMREX_USE_OMP)
#pragma omp parallel if (teamsize == 1 && Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*this,flags); mfi.isValid(); ++mfi)
    {
        Box const& cbox = amrex::grow(amrex::coarsen(mfi.validbox(),ratio),new_n_grow);
        this->fabPtr(mfi)->coarsen(ratio,cbox);
    }

    boxarray.coarsen(ratio);
    n_grow = new_n_grow;
}